

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::AuxNode,_capnp::compiler::NodeTranslator::AuxNode_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  AuxNode *pAVar1;
  
  pAVar1 = this->pos;
  if (this->start < pAVar1) {
    do {
      this->pos = pAVar1 + -1;
      if (pAVar1[-1].sourceInfo.builder.segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(&pAVar1[-1].sourceInfo.builder);
      }
      if (pAVar1[-1].node.builder.segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(pAVar1 + -1));
      }
      pAVar1 = this->pos;
    } while (this->start < pAVar1);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }